

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O2

Tile * __thiscall
nanovdb::
RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
::findTile(RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
           *this,CoordType *ijk)

{
  Tile *pTVar1;
  Tile *pTVar2;
  uint uVar3;
  KeyT KVar4;
  long lVar5;
  Tile *pTVar6;
  
  uVar3 = (this->
          super_RootData<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
          ).mTileCount;
  KVar4 = RootData<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
          ::CoordToKey(ijk);
  lVar5 = (ulong)(~((int)uVar3 >> 0x1f) & uVar3) + 1;
  pTVar6 = (Tile *)&(this->
                    super_RootData<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>
                    ).mTileCount;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      return (Tile *)0x0;
    }
    pTVar1 = pTVar6 + 1;
    pTVar2 = pTVar6 + 1;
    pTVar6 = pTVar1;
  } while (pTVar2->key != KVar4);
  return pTVar1;
}

Assistant:

__hostdev__ const Tile* findTile(const CoordType& ijk) const
    {
        // binary-search of pre-sorted elements
        int32_t     low = 0, high = DataType::mTileCount; // low is inclusive and high is exclusive
        const Tile* tiles = reinterpret_cast<const Tile*>(this + 1);
        const auto  key = DataType::CoordToKey(ijk);
#if 1 // switch between linear and binary seach
        for (int i = low; i < high; i++) {
            const Tile* tile = &tiles[i];
            if (tile->key == key)
                return tile;
        }
#else
        while (low != high) {
            int         mid = low + ((high - low) >> 1);
            const Tile* tile = &tiles[mid];
            if (tile->key == key) {
                return tile;
            } else if (tile->key < key) {
                low = mid + 1;
            } else {
                high = mid;
            }
        }
#endif
        return nullptr;
    }